

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_DimStyle * Internal_DimStyleMillimeterEngrave(void)

{
  ON_UUID id_00;
  ON_Font *font_characteristics;
  ON_DimStyle *in_RDI;
  ON_Font *font;
  ON_UUID id;
  ON_DimStyle *dimstyle;
  
  ON_DimStyle::ON_DimStyle(in_RDI);
  id_00.Data4[0] = 0xaa;
  id_00.Data4[1] = 'o';
  id_00.Data4[2] = 0xee;
  id_00.Data4[3] = 0x91;
  id_00.Data4[4] = 0xb3;
  id_00.Data4[5] = 0xbe;
  id_00.Data4[6] = 0x96;
  id_00.Data4[7] = 0xc6;
  id_00.Data1 = 0x741980ff;
  id_00.Data2 = 0xde0f;
  id_00.Data3 = 0x4ed7;
  Internal_DimStyleInit(L"Millimeter Engrave",-0xb,id_00,in_RDI);
  Internal_DimStyleMillimeterEngraveInit(in_RDI);
  font_characteristics = ON_Font::DefaultEngravingFont();
  if (font_characteristics != (ON_Font *)0x0) {
    ON_DimStyle::SetFont(in_RDI,font_characteristics);
  }
  Internal_SystemDimStyleFinalize(in_RDI);
  return in_RDI;
}

Assistant:

static ON_DimStyle Internal_DimStyleMillimeterEngrave()
{
  const ON_UUID id =
  { 0x741980ff, 0xde0f, 0x4ed7, { 0xaa, 0x6f, 0xee, 0x91, 0xb3, 0xbe, 0x96, 0xc6 } };

  ON_DimStyle dimstyle;
  Internal_DimStyleInit(L"Millimeter Engrave", -11, id, dimstyle);
  Internal_DimStyleMillimeterEngraveInit(dimstyle);
  const ON_Font* font = ON_Font::DefaultEngravingFont();
  if (nullptr != font)
    dimstyle.SetFont(*font);
  Internal_SystemDimStyleFinalize(dimstyle);
  return dimstyle;
}